

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomType.cpp
# Opt level: O2

void __thiscall OpenMD::AtomType::copyAllData(AtomType *this,AtomType *orig)

{
  mapped_type_conflict mVar1;
  mapped_type_conflict1 mVar2;
  mapped_type_conflict1 *pmVar3;
  _Base_ptr p_Var4;
  mapped_type_conflict *pmVar5;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  oprops;
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  local_60;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this->hasBase_ = orig->hasBase_;
  this->base_ = orig->base_;
  this->mass_ = orig->mass_;
  std::__cxx11::string::string((string *)&local_60,(string *)&orig->name_);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this->ident_ = orig->ident_;
  for (p_Var4 = (orig->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(orig->myResponsibilities_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&orig->myResponsibilities_,(key_type *)(p_Var4 + 1));
    mVar2 = *pmVar3;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->myResponsibilities_,(key_type *)(p_Var4 + 1));
    *pmVar3 = mVar2;
  }
  for (p_Var4 = (orig->myValues_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(orig->myValues_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&orig->myValues_,(key_type *)(p_Var4 + 1));
    mVar1 = *pmVar5;
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](&this->myValues_,(key_type *)(p_Var4 + 1));
    *pmVar5 = mVar1;
  }
  PropertyMap::getProperties(&local_60,&orig->properties_);
  for (p_Var6 = &(local_60.
                  super__Vector_base<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>;
      p_Var6 != &(local_60.
                  super__Vector_base<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->
                 super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>;
      p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var6);
    addProperty(this,(shared_ptr<OpenMD::GenericData> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  std::
  vector<std::shared_ptr<OpenMD::GenericData>,_std::allocator<std::shared_ptr<OpenMD::GenericData>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void AtomType::copyAllData(AtomType* orig) {
    // makes an exact replica of another atom type down to the
    // atom ID and any base attachments it may have.
    // use with caution!

    hasBase_ = orig->hasBase_;
    base_    = orig->base_;
    mass_    = orig->mass_;
    name_    = string(orig->name_);
    ident_   = orig->ident_;

    map<string, bool>::iterator i;
    ;
    map<string, RealType>::iterator j;

    for (i = orig->myResponsibilities_.begin();
         i != orig->myResponsibilities_.end(); ++i) {
      myResponsibilities_[(*i).first] = orig->myResponsibilities_[(*i).first];
    }

    for (j = orig->myValues_.begin(); j != orig->myValues_.end(); ++j) {
      myValues_[(*j).first] = orig->myValues_[(*j).first];
    }

    std::vector<std::shared_ptr<GenericData>> oprops = orig->getProperties();
    std::vector<std::shared_ptr<GenericData>>::iterator it;

    for (it = oprops.begin(); it != oprops.end(); ++it) {
      addProperty(*it);
    }
  }